

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

shared_ptr<Promise> createLoopedDelay(void)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Promise *in_RDI;
  shared_ptr<Promise> sVar3;
  shared_ptr<Delay> local_58;
  shared_ptr<Promise> local_48;
  undefined1 local_11;
  shared_ptr<Promise> *p;
  
  createLoopedDelay::max = createLoopedDelay::max + -1;
  if (createLoopedDelay::max == 0) {
    printf("DONE LOOP\n");
    local_11 = '\0';
    Promise::New();
    peVar1 = std::__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        in_RDI);
    Promise::Resolve(peVar1);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    timestamp();
    printf("Creating Looped Delay\n");
    std::make_shared<Delay,int>((int *)&local_58);
    std::shared_ptr<Promise>::shared_ptr<Delay,void>(&local_48,&local_58);
    Promise::Register((Promise *)&stack0xffffffffffffffc8,&local_48);
    peVar1 = std::__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &stack0xffffffffffffffc8);
    Promise::Then<createLoopedDelay()::__0>(in_RDI,(anon_class_1_0_00000001 *)peVar1);
    std::shared_ptr<Promise>::~shared_ptr((shared_ptr<Promise> *)&stack0xffffffffffffffc8);
    std::shared_ptr<Promise>::~shared_ptr(&local_48);
    std::shared_ptr<Delay>::~shared_ptr(&local_58);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Promise>)sVar3.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PromisePtr createLoopedDelay() {
  static int max = 5;
  if (!--max) {
    printf("DONE LOOP\n");
    auto p = Promise::New();
    p->Resolve();
    return p;
  }

  timestamp(); printf("Creating Looped Delay\n");
  return Promise::Register(std::make_shared<Delay>(2000))
      ->Then([](const std::shared_ptr<Promise>& p) {
        timestamp(); printf("Delay Resolved LOOPED\n");
        p->Resolve(createLoopedDelay());
      });
}